

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O1

void __thiscall GGSock::FileServer::~FileServer(FileServer *this)

{
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var1;
  pointer ptVar2;
  pointer *__ptr;
  pointer ptVar3;
  
  LOCK();
  (((this->m_impl)._M_t.
    super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
    .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->isRunning)._M_base =
       (__atomic_base<bool>)0x0;
  UNLOCK();
  _Var1._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
       .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
  ptVar2 = *(pointer *)((long)&(_Var1._M_head_impl)->workers + 8);
  for (ptVar3 = *(pointer *)
                 &((_Var1._M_head_impl)->workers).
                  super__Vector_base<std::thread,_std::allocator<std::thread>_>; ptVar3 != ptVar2;
      ptVar3 = ptVar3 + 1) {
    std::thread::join();
  }
  _Var1._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
       .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (Impl *)0x0) {
    std::default_delete<GGSock::FileServer::Impl>::operator()
              ((default_delete<GGSock::FileServer::Impl> *)this,_Var1._M_head_impl);
  }
  (this->m_impl)._M_t.
  super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>.
  _M_t.
  super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
  .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl = (Impl *)0x0;
  return;
}

Assistant:

FileServer::~FileServer() {
    m_impl->isRunning = false;

    for (auto & worker : m_impl->workers) {
        worker.join();
    }
}